

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void dump(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *points,vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *clusters)

{
  pointer puVar1;
  unsigned_long uVar2;
  pointer pvVar3;
  pointer pCVar4;
  unsigned_long *index;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar4 = (clusters->
           super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((clusters->super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
    uVar6 = 0;
    do {
      puVar1 = pCVar4[uVar6].members.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar5 = pCVar4[uVar6].members.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
        uVar2 = *puVar5;
        pvVar3 = (points->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        if (*(pointer *)
             ((long)&pvVar3[uVar2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data + 8) !=
            pvVar3[uVar2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pvVar3 = pvVar3 + uVar2;
          uVar7 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            std::ostream::_M_insert<double>
                      (*(double *)
                        (*(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + uVar7 * 8));
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)((long)*(pointer *)
                                          ((long)&(pvVar3->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                   *(long *)&(pvVar3->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
      }
      uVar6 = uVar6 + 1;
      pCVar4 = (clusters->
               super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(clusters->
                                    super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void dump(const std::vector<Container>& points,
    const std::vector<msc::Cluster<Scalar>>& clusters)
{
    for (std::size_t c = 0; c < clusters.size(); c++)
    {
        for (const auto& index : clusters[c].members)
        {
            const auto& point = points[index];
            std::cout << c;
            for (std::size_t k = 0; k < point.size(); k++)
                std::cout << " " << point[k];
            std::cout << std::endl;
        }
    }
}